

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O1

zip_t * zip_cstream_openwitherror(FILE *stream,int level,char mode,int *errnum)

{
  mz_bool mVar1;
  zip_t *pZip;
  uint uVar2;
  
  *errnum = 0;
  if (stream == (FILE *)0x0) {
    *errnum = -0x13;
  }
  else {
    uVar2 = 6;
    if (-1 < level) {
      uVar2 = level;
    }
    if ((uVar2 & 0xf) < 0xb) {
      pZip = (zip_t *)calloc(1,0x4e078);
      if (pZip != (zip_t *)0x0) {
        pZip->level = uVar2;
        if (mode < 'r') {
          if ((mode == 'a') || (mode == 'd')) {
            mVar1 = mz_zip_reader_init_cfile((mz_zip_archive *)pZip,stream,0,uVar2 | 0x800);
            if (mVar1 != 0) {
              if ((mode != 'd') && (mode != 'a')) {
                return pZip;
              }
              mVar1 = mz_zip_writer_init_from_reader_v2((mz_zip_archive *)pZip,(char *)0x0,0);
              if (mVar1 != 0) {
                return pZip;
              }
              *errnum = -0x20;
              mz_zip_reader_end_internal((mz_zip_archive *)pZip,1);
              goto LAB_001104ff;
            }
LAB_00110565:
            *errnum = -0x1e;
            goto LAB_001104ff;
          }
        }
        else {
          if (mode == 'r') {
            mVar1 = mz_zip_reader_init_cfile((mz_zip_archive *)pZip,stream,0,uVar2 | 0x800);
            if (mVar1 != 0) {
              return pZip;
            }
            goto LAB_00110565;
          }
          if (mode == 'w') {
            mVar1 = mz_zip_writer_init_cfile((mz_zip_archive *)pZip,stream,0x4000);
            if (mVar1 != 0) {
              return pZip;
            }
            *errnum = -0x1f;
            goto LAB_001104ff;
          }
        }
        *errnum = -4;
        goto LAB_001104ff;
      }
      *errnum = -0x15;
    }
    else {
      *errnum = -5;
    }
  }
  pZip = (zip_t *)0x0;
LAB_001104ff:
  if (pZip != (zip_t *)0x0) {
    free(pZip);
  }
  return (zip_t *)0x0;
}

Assistant:

struct zip_t *zip_cstream_openwitherror(FILE *stream, int level, char mode,
                                        int *errnum) {
  struct zip_t *zip = NULL;
  *errnum = 0;
  if (!stream) {
    // zip archive stream is NULL
    *errnum = ZIP_ENOFILE;
    goto cleanup;
  }

  if (level < 0)
    level = MZ_DEFAULT_LEVEL;
  if ((level & 0xF) > MZ_UBER_COMPRESSION) {
    // Wrong compression level
    *errnum = ZIP_EINVLVL;
    goto cleanup;
  }

  zip = (struct zip_t *)calloc((size_t)1, sizeof(struct zip_t));
  if (!zip) {
    // out of memory
    *errnum = ZIP_EOOMEM;
    goto cleanup;
  }

  zip->level = (mz_uint)level;
  switch (mode) {
  case 'w':
    // Create a new archive.
    if (!mz_zip_writer_init_cfile(&(zip->archive), stream,
                                  MZ_ZIP_FLAG_WRITE_ZIP64)) {
      // Cannot initialize zip_archive writer
      *errnum = ZIP_EWINIT;
      goto cleanup;
    }
    break;

  case 'r':
    if (!mz_zip_reader_init_cfile(
            &(zip->archive), stream, 0,
            zip->level | MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY)) {
      // An archive file does not exist or cannot initialize
      // zip_archive reader
      *errnum = ZIP_ERINIT;
      goto cleanup;
    }
    break;

  case 'a':
  case 'd':
    if (!mz_zip_reader_init_cfile(
            &(zip->archive), stream, 0,
            zip->level | MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY)) {
      // An archive file does not exist or cannot initialize
      // zip_archive reader
      *errnum = ZIP_ERINIT;
      goto cleanup;
    }
    if ((mode == 'a' || mode == 'd')) {
      if (!mz_zip_writer_init_from_reader_v2(&(zip->archive), NULL, 0)) {
        *errnum = ZIP_EWRINIT;
        mz_zip_reader_end(&(zip->archive));
        goto cleanup;
      }
    }
    break;

  default:
    *errnum = ZIP_EINVMODE;
    goto cleanup;
  }

  return zip;

cleanup:
  CLEANUP(zip);
  return NULL;
}